

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::storage_moved_alert::storage_moved_alert
          (storage_moved_alert *this,stack_allocator *alloc,torrent_handle *h,string_view p)

{
  allocation_slot aVar1;
  
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__storage_moved_alert_00455f38;
  aVar1 = aux::stack_allocator::copy_string(alloc,p);
  (this->m_path_idx).m_idx = aVar1.m_idx;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->path,p.ptr_,p.ptr_ + p.len_);
  return;
}

Assistant:

storage_moved_alert::storage_moved_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, string_view p)
		: torrent_alert(alloc, h)
		, m_path_idx(alloc.copy_string(p))
#if TORRENT_ABI_VERSION == 1
		, path(p)
#endif
	{}